

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operators.hpp
# Opt level: O0

ModulePtr chaiscript::bootstrap::operators::greater_than<std::__cxx11::string>(ModulePtr *m)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RSI;
  Module *in_RDI;
  ModulePtr MVar1;
  shared_ptr<chaiscript::Module> *in_stack_ffffffffffffff78;
  Module *this;
  allocator local_41;
  string local_40 [64];
  
  this = in_RDI;
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x3f42d3);
  fun<bool,std::__cxx11::string_const&,std::__cxx11::string_const&>
            ((_func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
              *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,">",&local_41);
  Module::add(this,(Proxy_Function *)in_RDI,in_RSI);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x3f4344);
  std::shared_ptr<chaiscript::Module>::shared_ptr
            ((shared_ptr<chaiscript::Module> *)in_RSI,in_stack_ffffffffffffff78);
  MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ModulePtr)MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModulePtr greater_than(ModulePtr m = std::make_shared<Module>())
        {
          m->add(chaiscript::fun(&detail::greater_than<const T&, const T&>), ">");
          return m;
        }